

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int nonce_function_bip340
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *xonly_pk32,uchar *algo16,void *data)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar masked_key [32];
  secp256k1_sha256 sha;
  byte local_b8 [32];
  secp256k1_sha256 local_98;
  
  if (algo16 == (uchar *)0x0) {
    return 0;
  }
  puVar7 = xonly_pk32;
  if (data != (void *)0x0) {
    local_98.s[0] = 0x24dd3219;
    local_98.s[1] = 0x4eba7e70;
    local_98.s[2] = 0xca0fabb9;
    local_98.s[3] = 0xfa3166d;
    local_98.s[4] = 0x3afbe4b1;
    local_98.s[5] = 0x4c44df97;
    local_98.s[6] = 0x4aac2739;
    local_98.s[7] = 0x249e850a;
    local_98.bytes = 0x40;
    secp256k1_sha256_write(&local_98,(uchar *)data,0x20);
    secp256k1_sha256_finalize(&local_98,local_b8);
    lVar4 = 0;
    do {
      puVar7 = (uchar *)CONCAT71((int7)((ulong)puVar7 >> 8),key32[lVar4]);
      local_b8[lVar4] = local_b8[lVar4] ^ key32[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
  }
  lVar4 = 0;
  do {
    puVar8 = (uchar *)((ulong)puVar7 & 0xffffffff);
    bVar1 = algo16[lVar4];
    bVar2 = "BIP0340/nonce"[lVar4];
    puVar7 = (uchar *)(ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      puVar7 = puVar8;
    }
    iVar5 = (int)puVar7;
    if (bVar1 != bVar2) goto LAB_004da481;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  iVar5 = 0;
LAB_004da481:
  if (iVar5 == 0) {
    local_98.s[0] = 0x46615b35;
    local_98.s[1] = 0xf4bfbff7;
    local_98.s[2] = 0x9f8dc671;
    local_98.s[3] = 0x83627ab3;
    local_98.s[4] = 0x60217180;
    local_98.s[5] = 0x57358661;
    local_98.s[6] = 0x21a29e54;
    local_98.s[7] = 0x68b07b4c;
    local_98.bytes = 0x40;
  }
  else {
    uVar3 = 0x11;
    do {
      uVar6 = uVar3 - 1;
      if (algo16[(ulong)uVar6 - 1] != '\0') goto LAB_004da49d;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    uVar6 = 0;
LAB_004da49d:
    secp256k1_sha256_initialize_tagged(&local_98,algo16,(long)(int)uVar6);
  }
  if (data != (void *)0x0) {
    key32 = local_b8;
  }
  secp256k1_sha256_write(&local_98,key32,0x20);
  secp256k1_sha256_write(&local_98,xonly_pk32,0x20);
  secp256k1_sha256_write(&local_98,msg32,0x20);
  secp256k1_sha256_finalize(&local_98,nonce32);
  return 1;
}

Assistant:

static int nonce_function_bip340(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo16, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo16 == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_bip340_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    }

    /* Tag the hash with algo16 which is important to avoid nonce reuse across
     * algorithms. If this nonce function is used in BIP-340 signing as defined
     * in the spec, an optimized tagging implementation is used. */
    if (secp256k1_memcmp_var(algo16, bip340_algo16, 16) == 0) {
        secp256k1_nonce_function_bip340_sha256_tagged(&sha);
    } else {
        int algo16_len = 16;
        /* Remove terminating null bytes */
        while (algo16_len > 0 && !algo16[algo16_len - 1]) {
            algo16_len--;
        }
        secp256k1_sha256_initialize_tagged(&sha, algo16, algo16_len);
    }

    /* Hash (masked-)key||pk||msg using the tagged hash as per the spec */
    if (data != NULL) {
        secp256k1_sha256_write(&sha, masked_key, 32);
    } else {
        secp256k1_sha256_write(&sha, key32, 32);
    }
    secp256k1_sha256_write(&sha, xonly_pk32, 32);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}